

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowDemoWindowColumns(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  float fVar4;
  ImVec2 IVar5;
  bool open2;
  int y;
  bool open1;
  int x;
  int j;
  int i_2;
  ImGuiListClipper clipper;
  int ITEMS_COUNT;
  ImVec2 child_size;
  int i_1;
  int lines_count;
  bool hovered;
  char label_1 [32];
  int i;
  char *paths [3];
  char *names [3];
  char label [32];
  int n;
  undefined4 in_stack_fffffffffffffe88;
  ImGuiSliderFlags in_stack_fffffffffffffe8c;
  float in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  ImVec2 *this;
  int in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  ImGuiListClipper *in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffeb8;
  ImGuiListClipper *this_00;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  float *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  uint local_120;
  uint local_118;
  uint local_114;
  uint local_110;
  ImGuiListClipper local_100;
  int local_e8;
  undefined1 local_e4 [16];
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  float in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  ImGuiSelectableFlags in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar6;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  float local_98 [11];
  uint local_6c;
  char *local_68 [4];
  ImVec2 local_48;
  bool *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char local_28 [36];
  uint local_4;
  
  bVar1 = ImGui::CollapsingHeader
                    (in_stack_fffffffffffffe98,(ImGuiTreeNodeFlags)in_stack_fffffffffffffe94);
  if (bVar1) {
    ImGui::PushID((char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    ImGui::Checkbox(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    ImGui::SameLine(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
    HelpMarker((char *)0x181aa9);
    if ((ShowDemoWindowColumns::disable_indent & 1U) != 0) {
      ImGui::PushStyleVar(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar1) {
      ImGui::Text("Without border:");
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::Separator();
      for (local_4 = 0; (int)local_4 < 0xe; local_4 = local_4 + 1) {
        sprintf(local_28,"Item %d",(ulong)local_4);
        in_stack_fffffffffffffed0 = local_28;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,0.0,0.0);
        ImGui::Selectable((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          SUB41((uint)in_stack_ffffffffffffff54 >> 0x18,0),in_stack_ffffffffffffff50
                          ,(ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        ImGui::NextColumn();
      }
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::Separator();
      ImGui::Text("With border:");
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::Separator();
      ImGui::Text("ID");
      ImGui::NextColumn();
      ImGui::Text("Name");
      ImGui::NextColumn();
      ImGui::Text("Path");
      ImGui::NextColumn();
      ImGui::Text("Hovered");
      ImGui::NextColumn();
      ImGui::Separator();
      local_48 = (ImVec2)((long)"Item One" + 5);
      in_stack_ffffffffffffffc0 = (bool *)0x1cb0a9;
      in_stack_ffffffffffffffc8 = "Three";
      local_68[0] = "/path/one";
      local_68[1] = "/path/two";
      local_68[2] = "/path/three";
      for (local_6c = 0; (int)local_6c < 3; local_6c = local_6c + 1) {
        sprintf((char *)local_98,"%04d",(ulong)local_6c);
        in_stack_fffffffffffffec8 = local_98;
        in_stack_fffffffffffffec4 =
             (float)CONCAT13(ShowDemoWindowColumns::selected == local_6c,
                             SUB43(in_stack_fffffffffffffec4,0));
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,0.0,0.0);
        bVar1 = ImGui::Selectable((char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58),
                                  SUB41((uint)in_stack_ffffffffffffff54 >> 0x18,0),
                                  in_stack_ffffffffffffff50,
                                  (ImVec2 *)
                                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (bVar1) {
          ShowDemoWindowColumns::selected = local_6c;
        }
        bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffe90);
        in_stack_ffffffffffffff5c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
        ImGui::NextColumn();
        ImGui::Text((char *)(&local_48)[(int)local_6c]);
        ImGui::NextColumn();
        ImGui::Text(local_68[(int)local_6c]);
        ImGui::NextColumn();
        ImGui::Text("%d",(ulong)((byte)((uint)in_stack_ffffffffffffff5c >> 0x18) & 1));
        ImGui::NextColumn();
      }
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::Separator();
      ImGui::TreePop();
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar1) {
      fVar4 = ImGui::GetFontSize();
      ImGui::SetNextItemWidth(fVar4 * 8.0);
      ImGui::DragInt((char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     &in_stack_fffffffffffffea8->DisplayStart,in_stack_fffffffffffffea4,
                     in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe8c);
      if (ShowDemoWindowColumns::columns_count < 2) {
        ShowDemoWindowColumns::columns_count = 2;
      }
      ImGui::SameLine(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
      ImGui::Checkbox(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      ImGui::SameLine(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
      ImGui::Checkbox(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      for (iVar6 = 0;
          SBORROW4(iVar6,ShowDemoWindowColumns::columns_count * 3) !=
          iVar6 + ShowDemoWindowColumns::columns_count * -3 < 0; iVar6 = iVar6 + 1) {
        if (((ShowDemoWindowColumns::h_borders & 1U) != 0) &&
           (iVar3 = ImGui::GetColumnIndex(), iVar3 == 0)) {
          ImGui::Separator();
        }
        ImGui::Text("%c%c%c",(ulong)(iVar6 + 0x61U),(ulong)(iVar6 + 0x61U));
        fVar4 = ImGui::GetColumnWidth((int)in_stack_fffffffffffffeb0);
        ImGui::Text((char *)(double)fVar4,"Width %.2f");
        IVar5 = ImGui::GetContentRegionAvail();
        ImGui::Text((char *)(double)IVar5.x,"Avail %.2f");
        fVar4 = ImGui::GetColumnOffset(in_stack_fffffffffffffea0);
        ImGui::Text((char *)(double)fVar4,"Offset %.2f");
        ImGui::Text("Long text that is likely to clip");
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff44,-1.1754944e-38,0.0);
        ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      (ImVec2 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        ImGui::NextColumn();
      }
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      if ((ShowDemoWindowColumns::h_borders & 1U) != 0) {
        ImGui::Separator();
      }
      ImGui::TreePop();
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar1) {
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::Separator();
      ImGui::Text("Hello");
      ImVec2::ImVec2(&local_c4,0.0,0.0);
      ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (ImVec2 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      ImGui::NextColumn();
      ImGui::Text("ImGui");
      ImVec2::ImVec2(&local_cc,0.0,0.0);
      ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (ImVec2 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      ImGui::InputFloat(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                        in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                        in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      ImGui::Text("An extra line here.");
      ImGui::NextColumn();
      ImGui::Text("Sailor");
      ImVec2::ImVec2(&local_d4,0.0,0.0);
      ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (ImVec2 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      ImGui::InputFloat(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                        in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                        in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      ImGui::NextColumn();
      bVar1 = ImGui::CollapsingHeader
                        (in_stack_fffffffffffffe98,(ImGuiTreeNodeFlags)in_stack_fffffffffffffe94);
      if (bVar1) {
        ImGui::Text("Blah blah blah");
      }
      ImGui::NextColumn();
      bVar1 = ImGui::CollapsingHeader
                        (in_stack_fffffffffffffe98,(ImGuiTreeNodeFlags)in_stack_fffffffffffffe94);
      if (bVar1) {
        ImGui::Text("Blah blah blah");
      }
      ImGui::NextColumn();
      bVar1 = ImGui::CollapsingHeader
                        (in_stack_fffffffffffffe98,(ImGuiTreeNodeFlags)in_stack_fffffffffffffe94);
      if (bVar1) {
        ImGui::Text("Blah blah blah");
      }
      ImGui::NextColumn();
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::Separator();
      ImGui::TreePop();
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar1) {
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::Separator();
      ImGui::TextWrapped("The quick brown fox jumps over the lazy dog.");
      ImGui::TextWrapped("Hello Left");
      ImGui::NextColumn();
      ImGui::TextWrapped("The quick brown fox jumps over the lazy dog.");
      ImGui::TextWrapped("Hello Right");
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::Separator();
      ImGui::TreePop();
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar1) {
      this = (ImVec2 *)(local_e4 + 8);
      in_stack_fffffffffffffea4 = 0.0;
      ImVec2::ImVec2(this,1500.0,0.0);
      ImGui::SetNextWindowContentSize(this);
      fVar4 = ImGui::GetFontSize();
      in_stack_fffffffffffffea8 = (ImGuiListClipper *)local_e4;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,fVar4 * 20.0);
      in_stack_fffffffffffffeb4 = 0;
      ImGui::BeginChild((char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),this,
                        SUB41((uint)in_stack_fffffffffffffe94 >> 0x18,0),
                        (ImGuiWindowFlags)in_stack_fffffffffffffe90);
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      local_e8 = 2000;
      this_00 = &local_100;
      ImGuiListClipper::ImGuiListClipper
                ((ImGuiListClipper *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      ImGuiListClipper::Begin(this_00,local_e8,-1.0);
      while (bVar1 = ImGuiListClipper::Step(in_stack_fffffffffffffea8), bVar1) {
        for (local_110 = local_100.DisplayStart; (int)local_110 < local_100.DisplayEnd;
            local_110 = local_110 + 1) {
          for (local_114 = 0; (int)local_114 < 10; local_114 = local_114 + 1) {
            ImGui::Text("Line %d Column %d...",(ulong)local_110,(ulong)local_114);
            ImGui::NextColumn();
          }
        }
      }
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::EndChild();
      ImGui::TreePop();
      ImGuiListClipper::~ImGuiListClipper(&local_100);
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar1) {
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      for (local_118 = 0; (int)local_118 < 3; local_118 = local_118 + 1) {
        bVar1 = ImGui::TreeNode((void *)(long)(int)local_118,"Node%d",(ulong)local_118);
        ImGui::NextColumn();
        ImGui::Text("Node contents");
        ImGui::NextColumn();
        if (bVar1) {
          for (local_120 = 0; (int)local_120 < 3; local_120 = local_120 + 1) {
            bVar1 = ImGui::TreeNode((void *)(long)(int)local_120,"Node%d.%d",(ulong)local_118,
                                    (ulong)local_120);
            ImGui::NextColumn();
            ImGui::Text("Node contents");
            if (bVar1) {
              ImGui::Text("Even more contents");
              bVar2 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88));
              if (bVar2) {
                ImGui::Text("The quick brown fox jumps over the lazy dog");
                ImGui::TreePop();
              }
            }
            ImGui::NextColumn();
            if (bVar1) {
              ImGui::TreePop();
            }
          }
          ImGui::TreePop();
        }
      }
      ImGui::Columns(in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                     SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
      ImGui::TreePop();
    }
    if ((ShowDemoWindowColumns::disable_indent & 1U) != 0) {
      ImGui::PopStyleVar((int)in_stack_fffffffffffffea4);
    }
    ImGui::PopID();
  }
  return;
}

Assistant:

static void ShowDemoWindowColumns()
{
    if (!ImGui::CollapsingHeader("Columns"))
        return;

    ImGui::PushID("Columns");

    static bool disable_indent = false;
    ImGui::Checkbox("Disable tree indentation", &disable_indent);
    ImGui::SameLine();
    HelpMarker("Disable the indenting of tree nodes so demo columns can use the full window width.");
    if (disable_indent)
        ImGui::PushStyleVar(ImGuiStyleVar_IndentSpacing, 0.0f);

    // Basic columns
    if (ImGui::TreeNode("Basic"))
    {
        ImGui::Text("Without border:");
        ImGui::Columns(3, "mycolumns3", false);  // 3-ways, no border
        ImGui::Separator();
        for (int n = 0; n < 14; n++)
        {
            char label[32];
            sprintf(label, "Item %d", n);
            if (ImGui::Selectable(label)) {}
            //if (ImGui::Button(label, ImVec2(-FLT_MIN,0.0f))) {}
            ImGui::NextColumn();
        }
        ImGui::Columns(1);
        ImGui::Separator();

        ImGui::Text("With border:");
        ImGui::Columns(4, "mycolumns"); // 4-ways, with border
        ImGui::Separator();
        ImGui::Text("ID"); ImGui::NextColumn();
        ImGui::Text("Name"); ImGui::NextColumn();
        ImGui::Text("Path"); ImGui::NextColumn();
        ImGui::Text("Hovered"); ImGui::NextColumn();
        ImGui::Separator();
        const char* names[3] = { "One", "Two", "Three" };
        const char* paths[3] = { "/path/one", "/path/two", "/path/three" };
        static int selected = -1;
        for (int i = 0; i < 3; i++)
        {
            char label[32];
            sprintf(label, "%04d", i);
            if (ImGui::Selectable(label, selected == i, ImGuiSelectableFlags_SpanAllColumns))
                selected = i;
            bool hovered = ImGui::IsItemHovered();
            ImGui::NextColumn();
            ImGui::Text(names[i]); ImGui::NextColumn();
            ImGui::Text(paths[i]); ImGui::NextColumn();
            ImGui::Text("%d", hovered); ImGui::NextColumn();
        }
        ImGui::Columns(1);
        ImGui::Separator();
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Borders"))
    {
        // NB: Future columns API should allow automatic horizontal borders.
        static bool h_borders = true;
        static bool v_borders = true;
        static int columns_count = 4;
        const int lines_count = 3;
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 8);
        ImGui::DragInt("##columns_count", &columns_count, 0.1f, 2, 10, "%d columns");
        if (columns_count < 2)
            columns_count = 2;
        ImGui::SameLine();
        ImGui::Checkbox("horizontal", &h_borders);
        ImGui::SameLine();
        ImGui::Checkbox("vertical", &v_borders);
        ImGui::Columns(columns_count, NULL, v_borders);
        for (int i = 0; i < columns_count * lines_count; i++)
        {
            if (h_borders && ImGui::GetColumnIndex() == 0)
                ImGui::Separator();
            ImGui::Text("%c%c%c", 'a' + i, 'a' + i, 'a' + i);
            ImGui::Text("Width %.2f", ImGui::GetColumnWidth());
            ImGui::Text("Avail %.2f", ImGui::GetContentRegionAvail().x);
            ImGui::Text("Offset %.2f", ImGui::GetColumnOffset());
            ImGui::Text("Long text that is likely to clip");
            ImGui::Button("Button", ImVec2(-FLT_MIN, 0.0f));
            ImGui::NextColumn();
        }
        ImGui::Columns(1);
        if (h_borders)
            ImGui::Separator();
        ImGui::TreePop();
    }

    // Create multiple items in a same cell before switching to next column
    if (ImGui::TreeNode("Mixed items"))
    {
        ImGui::Columns(3, "mixed");
        ImGui::Separator();

        ImGui::Text("Hello");
        ImGui::Button("Banana");
        ImGui::NextColumn();

        ImGui::Text("ImGui");
        ImGui::Button("Apple");
        static float foo = 1.0f;
        ImGui::InputFloat("red", &foo, 0.05f, 0, "%.3f");
        ImGui::Text("An extra line here.");
        ImGui::NextColumn();

        ImGui::Text("Sailor");
        ImGui::Button("Corniflower");
        static float bar = 1.0f;
        ImGui::InputFloat("blue", &bar, 0.05f, 0, "%.3f");
        ImGui::NextColumn();

        if (ImGui::CollapsingHeader("Category A")) { ImGui::Text("Blah blah blah"); } ImGui::NextColumn();
        if (ImGui::CollapsingHeader("Category B")) { ImGui::Text("Blah blah blah"); } ImGui::NextColumn();
        if (ImGui::CollapsingHeader("Category C")) { ImGui::Text("Blah blah blah"); } ImGui::NextColumn();
        ImGui::Columns(1);
        ImGui::Separator();
        ImGui::TreePop();
    }

    // Word wrapping
    if (ImGui::TreeNode("Word-wrapping"))
    {
        ImGui::Columns(2, "word-wrapping");
        ImGui::Separator();
        ImGui::TextWrapped("The quick brown fox jumps over the lazy dog.");
        ImGui::TextWrapped("Hello Left");
        ImGui::NextColumn();
        ImGui::TextWrapped("The quick brown fox jumps over the lazy dog.");
        ImGui::TextWrapped("Hello Right");
        ImGui::Columns(1);
        ImGui::Separator();
        ImGui::TreePop();
    }

    // Scrolling columns
    /*
    if (ImGui::TreeNode("Vertical Scrolling"))
    {
        ImGui::BeginChild("##header", ImVec2(0, ImGui::GetTextLineHeightWithSpacing()+ImGui::GetStyle().ItemSpacing.y));
        ImGui::Columns(3);
        ImGui::Text("ID"); ImGui::NextColumn();
        ImGui::Text("Name"); ImGui::NextColumn();
        ImGui::Text("Path"); ImGui::NextColumn();
        ImGui::Columns(1);
        ImGui::Separator();
        ImGui::EndChild();
        ImGui::BeginChild("##scrollingregion", ImVec2(0, 60));
        ImGui::Columns(3);
        for (int i = 0; i < 10; i++)
        {
            ImGui::Text("%04d", i); ImGui::NextColumn();
            ImGui::Text("Foobar"); ImGui::NextColumn();
            ImGui::Text("/path/foobar/%04d/", i); ImGui::NextColumn();
        }
        ImGui::Columns(1);
        ImGui::EndChild();
        ImGui::TreePop();
    }
    */

    if (ImGui::TreeNode("Horizontal Scrolling"))
    {
        ImGui::SetNextWindowContentSize(ImVec2(1500.0f, 0.0f));
        ImVec2 child_size = ImVec2(0, ImGui::GetFontSize() * 20.0f);
        ImGui::BeginChild("##ScrollingRegion", child_size, false, ImGuiWindowFlags_HorizontalScrollbar);
        ImGui::Columns(10);
        int ITEMS_COUNT = 2000;
        ImGuiListClipper clipper; // Also demonstrate using the clipper for large list
        clipper.Begin(ITEMS_COUNT);
        while (clipper.Step())
        {
            for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
                for (int j = 0; j < 10; j++)
                {
                    ImGui::Text("Line %d Column %d...", i, j);
                    ImGui::NextColumn();
                }
        }
        ImGui::Columns(1);
        ImGui::EndChild();
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Tree"))
    {
        ImGui::Columns(2, "tree", true);
        for (int x = 0; x < 3; x++)
        {
            bool open1 = ImGui::TreeNode((void*)(intptr_t)x, "Node%d", x);
            ImGui::NextColumn();
            ImGui::Text("Node contents");
            ImGui::NextColumn();
            if (open1)
            {
                for (int y = 0; y < 3; y++)
                {
                    bool open2 = ImGui::TreeNode((void*)(intptr_t)y, "Node%d.%d", x, y);
                    ImGui::NextColumn();
                    ImGui::Text("Node contents");
                    if (open2)
                    {
                        ImGui::Text("Even more contents");
                        if (ImGui::TreeNode("Tree in column"))
                        {
                            ImGui::Text("The quick brown fox jumps over the lazy dog");
                            ImGui::TreePop();
                        }
                    }
                    ImGui::NextColumn();
                    if (open2)
                        ImGui::TreePop();
                }
                ImGui::TreePop();
            }
        }
        ImGui::Columns(1);
        ImGui::TreePop();
    }

    if (disable_indent)
        ImGui::PopStyleVar();
    ImGui::PopID();
}